

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Mutex.cpp
# Opt level: O3

bool __thiscall axl::sys::psx::Mutex::lock(Mutex *this,uint_t timeout)

{
  uint_t code;
  timespec ts;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  if (timeout == 0xffffffff) {
    code = pthread_mutex_lock((pthread_mutex_t *)this);
  }
  else if (timeout == 0) {
    code = pthread_mutex_trylock((pthread_mutex_t *)this);
  }
  else {
    local_28.m_p = (ErrorHdr *)0x0;
    local_28.m_hdr = (BufHdr *)0x0;
    getAbsTimespecFromTimeout(timeout,(timespec *)&local_28);
    code = pthread_mutex_timedlock((pthread_mutex_t *)this,(timespec *)&local_28);
  }
  if (code != 0) {
    err::Error::Error((Error *)&local_28,code);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  return code == 0;
}

Assistant:

bool
Mutex::lock(uint_t timeout) {
	int result;

	switch (timeout) {
	case 0:
		result = ::pthread_mutex_trylock(&m_mutex);
		break;

	case -1:
		result = ::pthread_mutex_lock(&m_mutex);
		break;

	default:
		timespec ts = { 0 };
		sys::getAbsTimespecFromTimeout(timeout, &ts);
		result = ::pthread_mutex_timedlock(&m_mutex, &ts);
	}

	return result == 0 ? true : err::fail(result);
}